

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
* toml::try_parse<toml::type_config>
            (result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             *__return_storage_ptr__,istream *is,string fname,spec s)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined1 auVar2 [16];
  allocator_type local_8a;
  value_type_conflict2 local_89;
  vector<unsigned_char,_std::allocator<unsigned_char>_> letters;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  auVar2 = std::istream::tellg();
  std::istream::seekg((long)is,_S_beg);
  lVar1 = std::istream::tellg();
  std::istream::seekg(is,auVar2._0_8_,auVar2._8_8_);
  local_89 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&letters,lVar1 - auVar2._0_8_,&local_89,&local_8a);
  std::istream::read((char *)is,
                     (long)letters.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  local_68._M_impl.super__Vector_impl_data._M_start =
       letters.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68._M_impl.super__Vector_impl_data._M_finish =
       letters.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
       letters.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  letters.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  letters.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  letters.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string(&local_50,in_RDX);
  detail::parse_impl<toml::type_config>
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,(string *)&local_50,
             (spec *)&fname);
  std::__cxx11::string::~string((string *)&local_50);
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&letters);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, std::vector<error_info>>
try_parse(std::istream& is, std::string fname = "unknown file", spec s = spec::default_version())
{
    const auto beg = is.tellg();
    is.seekg(0, std::ios::end);
    const auto end = is.tellg();
    const auto fsize = end - beg;
    is.seekg(beg);

    // read whole file as a sequence of char
    assert(fsize >= 0);
    std::vector<detail::location::char_type> letters(static_cast<std::size_t>(fsize), '\0');
    is.read(reinterpret_cast<char*>(letters.data()), static_cast<std::streamsize>(fsize));

    return detail::parse_impl<TC>(std::move(letters), std::move(fname), std::move(s));
}